

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_force_event(intptr_t uuid,fio_io_event ev)

{
  fio_defer_task_s task;
  uint uVar1;
  long lVar2;
  fio_task_queue_s *queue;
  code *pcVar3;
  undefined1 *puVar4;
  fio_lock_i ret;
  
  if (uuid < 0) {
    return;
  }
  uVar1 = (uint)((ulong)uuid >> 8);
  if (fio_data->capa <= uVar1) {
    return;
  }
  lVar2 = (long)(int)uVar1 * 0xa8;
  if (*(char *)((long)fio_data + lVar2 + 0x6d) != (char)uuid) {
    return;
  }
  if (ev == FIO_EVENT_ON_TIMEOUT) {
    pcVar3 = deferred_ping;
    puVar4 = (undefined1 *)0x0;
  }
  else {
    if (ev == FIO_EVENT_ON_READY) {
      pcVar3 = deferred_on_ready;
      puVar4 = (undefined1 *)0x0;
      queue = &task_queue_urgent;
      goto LAB_001274b1;
    }
    if (ev != FIO_EVENT_ON_DATA) {
      return;
    }
    LOCK();
    *(undefined1 *)((long)fio_data + lVar2 + 0x6b) = 1;
    UNLOCK();
    puVar4 = &DAT_00000001;
    pcVar3 = deferred_on_data;
  }
  queue = &task_queue_normal;
LAB_001274b1:
  task.arg1 = (void *)uuid;
  task.func = pcVar3;
  task.arg2 = puVar4;
  fio_defer_push_task_fn(task,queue);
  return;
}

Assistant:

void fio_force_event(intptr_t uuid, enum fio_io_event ev) {
  if (!uuid_is_valid(uuid))
    return;
  switch (ev) {
  case FIO_EVENT_ON_DATA:
    fio_trylock(&uuid_data(uuid).scheduled);
    fio_defer_push_task(deferred_on_data, (void *)uuid, (void *)1);
    break;
  case FIO_EVENT_ON_TIMEOUT:
    fio_defer_push_task(deferred_ping, (void *)uuid, NULL);
    break;
  case FIO_EVENT_ON_READY:
    fio_defer_push_urgent(deferred_on_ready, (void *)uuid, NULL);
    break;
  }
}